

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_print_glsl_visitor.cpp
# Opt level: O2

void __thiscall ir_print_glsl_visitor::visit(ir_print_glsl_visitor *this,ir_if *ir)

{
  exec_node *peVar1;
  
  string_buffer::asprintf_append(this->buffer,"if (");
  (*(ir->condition->super_ir_instruction)._vptr_ir_instruction[2])(ir->condition,this);
  string_buffer::asprintf_append(this->buffer,") {\n");
  this->indentation = this->indentation + 1;
  this->previous_skipped = false;
  peVar1 = &(ir->then_instructions).head_sentinel;
  while (peVar1 = ((exec_node *)&peVar1->next)->next, peVar1->next != (exec_node *)0x0) {
    indent(this);
    (*(code *)(peVar1 + -2)[1].prev[1].next)(&(peVar1 + -2)[1].prev,this);
    end_statement_line(this);
  }
  this->indentation = this->indentation + -1;
  indent(this);
  string_buffer::asprintf_append(this->buffer,"}");
  if ((ir->else_instructions).head_sentinel.next != &(ir->else_instructions).tail_sentinel) {
    peVar1 = &(ir->else_instructions).head_sentinel;
    string_buffer::asprintf_append(this->buffer," else {\n");
    this->indentation = this->indentation + 1;
    this->previous_skipped = false;
    while (peVar1 = ((exec_node *)&peVar1->next)->next, peVar1->next != (exec_node *)0x0) {
      indent(this);
      (*(code *)peVar1[-1].prev[1].next)(&peVar1[-1].prev,this);
      end_statement_line(this);
    }
    this->indentation = this->indentation + -1;
    indent(this);
    string_buffer::asprintf_append(this->buffer,"}");
    return;
  }
  return;
}

Assistant:

void
ir_print_glsl_visitor::visit(ir_if *ir)
{
   buffer.asprintf_append ("if (");
   ir->condition->accept(this);

   buffer.asprintf_append (") {\n");
	indentation++; previous_skipped = false;


   foreach_in_list(ir_instruction, inst, &ir->then_instructions) {
      indent();
      inst->accept(this);
	   end_statement_line();
   }

   indentation--;
   indent();
   buffer.asprintf_append ("}");

   if (!ir->else_instructions.is_empty())
   {
	   buffer.asprintf_append (" else {\n");
	   indentation++; previous_skipped = false;

	   foreach_in_list(ir_instruction, inst, &ir->else_instructions) {
		  indent();
		  inst->accept(this);
		   end_statement_line();
	   }
	   indentation--;
	   indent();
	   buffer.asprintf_append ("}");
   }
}